

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int __thiscall CServer::Run(CServer *this)

{
  NETADDR_conflict BindAddr_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  IConsole *pIVar4;
  CConfig *pCVar5;
  IEngine *pIVar6;
  IGameServer *pIVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64 iVar8;
  int64 iVar9;
  CServer *in_RDI;
  long in_FS_OFFSET;
  int i;
  int c_2;
  bool ShouldSnap;
  bool NewTicks;
  int64 Now;
  int c_1;
  int c;
  bool aSpecs [64];
  char aBuf [256];
  NETADDR_conflict BindAddr;
  undefined8 in_stack_fffffffffffffd48;
  CNetBase *this_00;
  CServer *in_stack_fffffffffffffd50;
  CServer *this_01;
  char *in_stack_fffffffffffffd58;
  CServer *this_02;
  int iVar10;
  undefined4 in_stack_fffffffffffffd64;
  CServer *in_stack_fffffffffffffd68;
  code *pConfig;
  code *this_03;
  char *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  IConsole *in_stack_fffffffffffffd88;
  CConfig *in_stack_fffffffffffffd90;
  CNetServer *in_stack_fffffffffffffd98;
  CRegister *in_stack_fffffffffffffda0;
  CServerBan *pCVar11;
  undefined4 in_stack_fffffffffffffe20;
  int iVar12;
  CServer *this_04;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  uint uVar13;
  undefined2 in_stack_fffffffffffffe44;
  undefined1 in_stack_fffffffffffffe46;
  byte bVar14;
  undefined1 in_stack_fffffffffffffe47;
  byte bVar15;
  int local_1b0;
  uint local_1ac;
  int local_19c;
  byte abStack_198 [64];
  char local_158 [264];
  CNetBase *local_50;
  CServer *local_48;
  CServer *local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  CServer *local_30;
  undefined4 local_28;
  undefined2 uStack_24;
  undefined2 uStack_22;
  long local_20;
  
  uVar13 = (uint)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar4 = Console(in_RDI);
  pCVar5 = Config(in_RDI);
  iVar2 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x17])
                    (pIVar4,(ulong)(uint)pCVar5->m_ConsoleOutputLevel,SendRconLineAuthed,in_RDI);
  iVar12 = (int)pIVar4;
  in_RDI->m_PrintCBIndex = iVar2;
  InitMapList(in_stack_fffffffffffffd68);
  Config(in_RDI);
  iVar2 = LoadMap((CServer *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                  in_stack_fffffffffffffd78);
  if (iVar2 == 0) {
    pCVar5 = Config(in_RDI);
    dbg_msg("server","failed to load map. mapname=\'%s\'",pCVar5->m_SvMap);
    Free(in_stack_fffffffffffffd50);
    local_19c = -1;
    goto LAB_001136e5;
  }
  pCVar5 = Config(in_RDI);
  in_RDI->m_MapChunksPerRequest = pCVar5->m_SvMapDownloadSpeed;
  pCVar5 = Config(in_RDI);
  if (pCVar5->m_Bindaddr[0] == '\0') {
LAB_00112c13:
    mem_zero(in_stack_fffffffffffffd50,uVar13);
    local_38 = 3;
    pCVar5 = Config(in_RDI);
    uStack_24 = (undefined2)pCVar5->m_SvPort;
  }
  else {
    Config(in_RDI);
    iVar2 = net_host_lookup(in_stack_fffffffffffffd58,(NETADDR *)in_stack_fffffffffffffd50,uVar13);
    if (iVar2 != 0) goto LAB_00112c13;
    local_38 = 3;
    pCVar5 = Config(in_RDI);
    uStack_24 = (undefined2)pCVar5->m_SvPort;
  }
  local_50 = (CNetBase *)CONCAT44(uStack_34,local_38);
  local_48 = local_30;
  local_40 = (CServer *)CONCAT26(uStack_22,CONCAT24(uStack_24,local_28));
  Config(in_RDI);
  Console(in_RDI);
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar6 = IKernel::RequestInterface<IEngine>((IKernel *)in_stack_fffffffffffffd50);
  pCVar11 = &in_RDI->m_ServerBan;
  pCVar5 = Config(in_RDI);
  iVar2 = pCVar5->m_SvMaxClients;
  pCVar5 = Config(in_RDI);
  iVar10 = pCVar5->m_SvMaxClientsPerIP;
  pConfig = NewClientCallback;
  this_03 = DelClientCallback;
  BindAddr_00.ip._4_8_ = pCVar11;
  BindAddr_00._0_8_ = pIVar6;
  BindAddr_00.ip[0xc] = (char)in_stack_fffffffffffffe20;
  BindAddr_00.ip[0xd] = (char)((uint)in_stack_fffffffffffffe20 >> 8);
  BindAddr_00.ip[0xe] = (char)((uint)in_stack_fffffffffffffe20 >> 0x10);
  BindAddr_00.ip[0xf] = (char)((uint)in_stack_fffffffffffffe20 >> 0x18);
  BindAddr_00.port = (short)iVar2;
  BindAddr_00.reserved = (short)((uint)iVar2 >> 0x10);
  this_00 = local_50;
  this_01 = local_48;
  this_02 = local_40;
  this_04 = in_RDI;
  bVar1 = CNetServer::Open(in_stack_fffffffffffffd98,BindAddr_00,in_stack_fffffffffffffd90,
                           in_stack_fffffffffffffd88,
                           (IEngine *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                           (CNetBan *)in_RDI,0,iVar12,(NETFUNC_NEWCLIENT)in_RDI,
                           (NETFUNC_DELCLIENT)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                           (void *)CONCAT17(in_stack_fffffffffffffe47,
                                            CONCAT16(in_stack_fffffffffffffe46,
                                                     CONCAT24(in_stack_fffffffffffffe44,
                                                              in_stack_fffffffffffffe40))));
  if (bVar1) {
    Config(this_04);
    Console(this_04);
    CEcon::Init((CEcon *)this_03,(CConfig *)pConfig,
                (IConsole *)CONCAT44(in_stack_fffffffffffffd64,iVar10),(CNetBan *)this_02);
    pCVar5 = Config(this_04);
    str_format(local_158,0x100,"server name is \'%s\'",pCVar5->m_SvName);
    pIVar4 = Console(this_04);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x19])(pIVar4,0,"server",local_158);
    pIVar7 = GameServer(this_04);
    (*(pIVar7->super_IInterface)._vptr_IInterface[2])();
    pIVar7 = GameServer(this_04);
    iVar2 = (*(pIVar7->super_IInterface)._vptr_IInterface[0x15])();
    str_format(local_158,0x100,"netversion %s",CONCAT44(extraout_var,iVar2));
    pIVar4 = Console(this_04);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x19])(pIVar4,0,"server",local_158);
    pIVar7 = GameServer(this_04);
    (*(pIVar7->super_IInterface)._vptr_IInterface[0x16])();
    pIVar7 = GameServer(this_04);
    (*(pIVar7->super_IInterface)._vptr_IInterface[0x17])();
    iVar2 = str_comp((char *)this_01,(char *)this_00);
    if (iVar2 != 0) {
      (*(this_04->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this_04->m_pConsole,0,"server","WARNING: netversion hash differs");
    }
    pIVar7 = GameServer(this_04);
    iVar2 = (*(pIVar7->super_IInterface)._vptr_IInterface[0x14])();
    str_format(local_158,0x100,"game version %s",CONCAT44(extraout_var_00,iVar2));
    pIVar4 = Console(this_04);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x19])(pIVar4,0,"server",local_158);
    (*(this_04->m_pConsole->super_IInterface)._vptr_IInterface[0x10])(this_04->m_pConsole,0);
    if (this_04->m_GeneratedRconPassword != 0) {
      dbg_msg("server","+-------------------------+");
      pCVar5 = Config(this_04);
      dbg_msg("server","| rcon password: \'%s\' |",pCVar5->m_SvRconPassword);
      dbg_msg("server","+-------------------------+");
    }
    iVar8 = time_get();
    this_04->m_GameStartTime = iVar8;
    do {
      if ((this_04->m_RunServer & 1U) == 0) goto LAB_00113685;
      if (((this_04->m_MapReload & 1U) != 0) ||
         (0x6ffffffe < (this_04->super_IServer).m_CurrentGameTick)) {
        this_04->m_MapReload = false;
        Config(this_04);
        iVar2 = LoadMap((CServer *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                        (char *)in_RDI);
        if (iVar2 == 0) {
          pCVar5 = Config(this_04);
          str_format(local_158,0x100,"failed to load map. mapname=\'%s\'",pCVar5->m_SvMap);
          pIVar4 = Console(this_04);
          (*(pIVar4->super_IInterface)._vptr_IInterface[0x19])(pIVar4,0,"server",local_158);
          Config(this_04);
          str_copy((char *)this_01,(char *)this_00,0);
        }
        else {
          for (local_1ac = 0; (int)local_1ac < 0x40; local_1ac = local_1ac + 1) {
            pIVar7 = GameServer(this_04);
            iVar2 = (*(pIVar7->super_IInterface)._vptr_IInterface[0x12])(pIVar7,(ulong)local_1ac);
            abStack_198[(int)local_1ac] = (byte)iVar2 & 1;
          }
          pIVar7 = GameServer(this_04);
          (*(pIVar7->super_IInterface)._vptr_IInterface[4])();
          for (local_1b0 = 0; local_1b0 < 0x40; local_1b0 = local_1b0 + 1) {
            if (1 < this_04->m_aClients[local_1b0].m_State) {
              SendMap((CServer *)CONCAT44(in_stack_fffffffffffffd64,iVar10),
                      (int)((ulong)this_02 >> 0x20));
              CClient::Reset((CClient *)this_01);
              iVar2 = 2;
              if ((abStack_198[local_1b0] & 1) != 0) {
                iVar2 = 3;
              }
              this_04->m_aClients[local_1b0].m_State = iVar2;
            }
          }
          iVar8 = time_get();
          this_04->m_GameStartTime = iVar8;
          (this_04->super_IServer).m_CurrentGameTick = 0;
          IInterface::Kernel((IInterface *)this_04);
          GameServer(this_04);
          IKernel::ReregisterInterface<IGameServer>((IKernel *)this_01,(IGameServer *)this_00);
          pIVar7 = GameServer(this_04);
          (*(pIVar7->super_IInterface)._vptr_IInterface[2])();
        }
      }
      iVar8 = time_get();
      bVar15 = 0;
      bVar14 = 0;
      while( true ) {
        iVar9 = TickStartTime(this_01,(int)((ulong)this_00 >> 0x20));
        iVar2 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
        if (iVar8 <= iVar9) break;
        (this_04->super_IServer).m_CurrentGameTick = (this_04->super_IServer).m_CurrentGameTick + 1;
        bVar15 = 1;
        if ((this_04->super_IServer).m_CurrentGameTick % 2 == 0) {
          bVar14 = 1;
        }
        for (uVar13 = 0; (int)uVar13 < 0x40; uVar13 = uVar13 + 1) {
          if (this_04->m_aClients[(int)uVar13].m_State != 0) {
            for (iVar2 = 0; iVar2 < 200; iVar2 = iVar2 + 1) {
              iVar12 = this_04->m_aClients[(int)uVar13].m_aInputs[iVar2].m_GameTick;
              iVar3 = IServer::Tick(&this_04->super_IServer);
              if (iVar12 == iVar3) {
                if (this_04->m_aClients[(int)uVar13].m_State == 5) {
                  pIVar7 = GameServer(this_04);
                  (*(pIVar7->super_IInterface)._vptr_IInterface[0xe])
                            (pIVar7,(ulong)uVar13,this_04->m_aClients[(int)uVar13].m_aInputs + iVar2
                            );
                }
                break;
              }
            }
          }
        }
        pIVar7 = GameServer(this_04);
        (*(pIVar7->super_IInterface)._vptr_IInterface[5])();
      }
      if ((bVar15 & 1) != 0) {
        pCVar5 = Config(this_04);
        if ((pCVar5->m_SvHighBandwidth != 0) || ((bVar14 & 1) != 0)) {
          DoSnapshot(this_04);
        }
        UpdateClientRconCommands((CServer *)CONCAT44(in_stack_fffffffffffffd64,iVar10));
        UpdateClientMapListEntries((CServer *)CONCAT44(in_stack_fffffffffffffd64,iVar10));
      }
      CNetBase::NetType(&(this_04->m_NetServer).super_CNetBase);
      CRegister::RegisterUpdate(in_stack_fffffffffffffda0,iVar2);
      PumpNetwork(this_02);
      in_stack_fffffffffffffda0 = (CRegister *)&this_04->m_NetServer;
      iVar8 = TickStartTime(this_01,(int)((ulong)this_00 >> 0x20));
      iVar9 = time_get();
      in_stack_fffffffffffffd98 = (CNetServer *)((iVar8 - iVar9) * 1000);
      iVar8 = time_freq();
      clamp<int>((int)((long)in_stack_fffffffffffffd98 / iVar8),1,10);
      CNetBase::Wait(this_00,0);
    } while (InterruptSignaled == 0);
    pIVar4 = Console(this_04);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x19])(pIVar4,0,"server","interrupted");
LAB_00113685:
    CNetServer::Close((CNetServer *)CONCAT44(in_stack_fffffffffffffd64,iVar10),(char *)this_02);
    CEcon::Shutdown((CEcon *)this_01);
    pIVar7 = GameServer(this_04);
    (*(pIVar7->super_IInterface)._vptr_IInterface[4])();
    Free(this_01);
    local_19c = 0;
  }
  else {
    pCVar5 = Config(this_04);
    dbg_msg("server","couldn\'t open socket. port %d might already be in use",
            (ulong)(uint)pCVar5->m_SvPort);
    Free(this_01);
    local_19c = -1;
  }
LAB_001136e5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return local_19c;
}

Assistant:

int CServer::Run()
{
	//
	m_PrintCBIndex = Console()->RegisterPrintCallback(Config()->m_ConsoleOutputLevel, SendRconLineAuthed, this);

	InitMapList();

	// load map
	if(!LoadMap(Config()->m_SvMap))
	{
		dbg_msg("server", "failed to load map. mapname='%s'", Config()->m_SvMap);
		Free();
		return -1;
	}
	m_MapChunksPerRequest = Config()->m_SvMapDownloadSpeed;

	// start server
	NETADDR BindAddr;
	if(Config()->m_Bindaddr[0] && net_host_lookup(Config()->m_Bindaddr, &BindAddr, NETTYPE_ALL) == 0)
	{
		// sweet!
		BindAddr.type = NETTYPE_ALL;
		BindAddr.port = Config()->m_SvPort;
	}
	else
	{
		mem_zero(&BindAddr, sizeof(BindAddr));
		BindAddr.type = NETTYPE_ALL;
		BindAddr.port = Config()->m_SvPort;
	}

	if(!m_NetServer.Open(BindAddr, Config(), Console(), Kernel()->RequestInterface<IEngine>(), &m_ServerBan,
		Config()->m_SvMaxClients, Config()->m_SvMaxClientsPerIP, NewClientCallback, DelClientCallback, this))
	{
		dbg_msg("server", "couldn't open socket. port %d might already be in use", Config()->m_SvPort);
		Free();
		return -1;
	}

	m_Econ.Init(Config(), Console(), &m_ServerBan);

	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "server name is '%s'", Config()->m_SvName);
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);

	GameServer()->OnInit();
	str_format(aBuf, sizeof(aBuf), "netversion %s", GameServer()->NetVersion());
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);
	if(str_comp(GameServer()->NetVersionHashUsed(), GameServer()->NetVersionHashReal()))
	{
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "WARNING: netversion hash differs");
	}
	str_format(aBuf, sizeof(aBuf), "game version %s", GameServer()->Version());
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);

	// process pending commands
	m_pConsole->StoreCommands(false);

	if(m_GeneratedRconPassword)
	{
		dbg_msg("server", "+-------------------------+");
		dbg_msg("server", "| rcon password: '%s' |", Config()->m_SvRconPassword);
		dbg_msg("server", "+-------------------------+");
	}

	// start game
	{
		m_GameStartTime = time_get();

		while(m_RunServer)
		{
			// load new map
			if(m_MapReload || m_CurrentGameTick >= 0x6FFFFFFF) //	force reload to make sure the ticks stay within a valid range
			{
				m_MapReload = false;

				// load map
				if(LoadMap(Config()->m_SvMap))
				{
					// new map loaded
					bool aSpecs[MAX_CLIENTS];
					for(int c = 0; c < MAX_CLIENTS; c++)
						aSpecs[c] = GameServer()->IsClientSpectator(c);

					GameServer()->OnShutdown();

					for(int c = 0; c < MAX_CLIENTS; c++)
					{
						if(m_aClients[c].m_State <= CClient::STATE_AUTH)
							continue;

						SendMap(c);
						m_aClients[c].Reset();
						m_aClients[c].m_State = aSpecs[c] ? CClient::STATE_CONNECTING_AS_SPEC : CClient::STATE_CONNECTING;
					}

					m_GameStartTime = time_get();
					m_CurrentGameTick = 0;
					Kernel()->ReregisterInterface(GameServer());
					GameServer()->OnInit();
				}
				else
				{
					str_format(aBuf, sizeof(aBuf), "failed to load map. mapname='%s'", Config()->m_SvMap);
					Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);
					str_copy(Config()->m_SvMap, m_aCurrentMap, sizeof(Config()->m_SvMap));
				}
			}

			int64 Now = time_get();
			bool NewTicks = false;
			bool ShouldSnap = false;
			while(Now > TickStartTime(m_CurrentGameTick+1))
			{
				m_CurrentGameTick++;
				NewTicks = true;
				if((m_CurrentGameTick%2) == 0)
					ShouldSnap = true;

				// apply new input
				for(int c = 0; c < MAX_CLIENTS; c++)
				{
					if(m_aClients[c].m_State == CClient::STATE_EMPTY)
						continue;
					for(int i = 0; i < 200; i++)
					{
						if(m_aClients[c].m_aInputs[i].m_GameTick == Tick())
						{
							if(m_aClients[c].m_State == CClient::STATE_INGAME)
								GameServer()->OnClientPredictedInput(c, m_aClients[c].m_aInputs[i].m_aData);
							break;
						}
					}
				}

				GameServer()->OnTick();
			}

			// snap game
			if(NewTicks)
			{
				if(Config()->m_SvHighBandwidth || ShouldSnap)
					DoSnapshot();

				UpdateClientRconCommands();
				UpdateClientMapListEntries();
			}

			// master server stuff
			m_Register.RegisterUpdate(m_NetServer.NetType());

			PumpNetwork();

			// wait for incoming data
			m_NetServer.Wait(clamp(int((TickStartTime(m_CurrentGameTick+1)-time_get())*1000/time_freq()), 1, 1000/SERVER_TICK_SPEED/2));

			if(InterruptSignaled)
			{
				Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "interrupted");
				break;
			}
		}
	}
	// disconnect all clients on shutdown
	m_NetServer.Close(m_aShutdownReason);
	m_Econ.Shutdown();

	GameServer()->OnShutdown();
	Free();

	return 0;
}